

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O2

void testEigen(void)

{
  initializer_list<double> __l;
  allocator_type local_59;
  _Vector_base<double,_std::allocator<double>_> local_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  double local_28 [4];
  
  local_28[2] = -1.87832;
  local_28[3] = -0.882024;
  local_28[0] = 1.87832;
  local_28[1] = -0.0950376;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_58,__l,&local_59);
  eigenSolverMonic((vector<double,_std::allocator<double>_> *)&local_40,
                   (vector<double,_std::allocator<double>_> *)&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void testEigen()
{
    eigenSolverMonic({{1.87832,-0.0950376,-1.87832,-0.882024}});
}